

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void setupTestInstruction(Setup *s,u32 pc,u16 opcode)

{
  InstrInfo IVar1;
  Instr local_28;
  Instr instr;
  u16 opcode_local;
  u32 pc_local;
  Setup *s_local;
  
  IVar1 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,opcode);
  local_28 = IVar1.I;
  if (((local_28 != RTE) && (local_28 == MOVEC)) && (s->round % 2 != 0)) {
    s->ext1 = s->ext1 & 0xf000;
    if (setupTestInstruction::mvc % 2 != 0) {
      s->ext1 = s->ext1 | 0x800;
    }
    s->ext1 = s->ext1 | (ushort)(setupTestInstruction::mvc >> 2) & 0xff;
  }
  s->pc = pc;
  s->opcode = opcode;
  set16(s->mem,pc,opcode);
  set16(s->mem,pc + 2,s->ext1);
  set16(s->mem,pc + 4,s->ext2);
  set16(s->mem,pc + 6,s->ext3);
  memcpy(musashiMem,s->mem,0x10000);
  memcpy(moiraMem,s->mem,0x10000);
  return;
}

Assistant:

void setupTestInstruction(Setup &s, u32 pc, u16 opcode)
{
    static long mvc = 0;

    moira::Instr instr = moiracpu->getInstrInfo(opcode).I;

    // Prepare special extension words for some instructions
    switch (instr) {

        case Instr::RTE:

            break;

        case Instr::MOVEC:
        {
            if (s.round % 2) {

                s.ext1 &= 0xF000;
                if (mvc % 2) s.ext1 |= 0x800;
                s.ext1 |= (mvc >> 2) & 0xFF;
            }
            break;
        }
        default:
            break;
    }

    s.pc = pc;
    s.opcode = opcode;

    set16(s.mem, pc, opcode);
    set16(s.mem, pc + 2, s.ext1);
    set16(s.mem, pc + 4, s.ext2);
    set16(s.mem, pc + 6, s.ext3);

    memcpy(musashiMem, s.mem, sizeof(musashiMem));
    memcpy(moiraMem, s.mem, sizeof(moiraMem));
}